

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NgammaT.cpp
# Opt level: O0

RealType __thiscall OpenMD::NgammaT::calcConservedQuantity(NgammaT *this)

{
  int iVar1;
  double *pdVar2;
  long *in_RDI;
  RealType RVar3;
  double dVar4;
  RealType conservedQuantity;
  RealType area;
  Mat3x3d hmat;
  RealType barostat_potential;
  RealType barostat_kinetic;
  RealType trEta;
  SquareMatrix<double,_3> tmp;
  RealType thermostat_potential;
  RealType thermostat_kinetic;
  RealType totalEnergy;
  Snapshot *in_stack_fffffffffffffe18;
  SimInfo *in_stack_fffffffffffffe20;
  Thermo *in_stack_fffffffffffffe30;
  SquareMatrix3<double> *in_stack_fffffffffffffe40;
  SquareMatrix3<double> *in_stack_fffffffffffffe48;
  RectMatrix<double,_3U,_3U> local_178;
  double local_130;
  double local_128;
  double local_120;
  SquareMatrix<double,_3> local_78;
  double local_30;
  double local_28;
  RealType local_20;
  pair<double,_double> local_18;
  
  local_18 = Snapshot::getThermostat((Snapshot *)in_RDI[0x1c]);
  std::pair<double,_double>::operator=((pair<double,_double> *)(in_RDI + 0x34),&local_18);
  (**(code **)(*in_RDI + 0xc0))();
  iVar1 = SimInfo::getNGlobalIntegrableObjects((SimInfo *)in_RDI[0xe]);
  in_RDI[0x1f] = (long)((double)iVar1 * 8.31451e-07 * (double)in_RDI[0x26]);
  iVar1 = SimInfo::getNdf(in_stack_fffffffffffffe20);
  in_RDI[0x20] = (long)((double)iVar1 * 8.31451e-07 * (double)in_RDI[0x26]);
  local_20 = Thermo::getTotalEnergy(in_stack_fffffffffffffe30);
  local_28 = ((double)in_RDI[0x20] * (double)in_RDI[0x21] * (double)in_RDI[0x34] *
             (double)in_RDI[0x34]) / 0.0008368;
  local_30 = ((double)in_RDI[0x20] * (double)in_RDI[0x35]) / 0.0004184;
  SquareMatrix3<double>::transpose(in_stack_fffffffffffffe48);
  OpenMD::operator*(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  SquareMatrix<double,_3>::SquareMatrix
            ((SquareMatrix<double,_3> *)in_stack_fffffffffffffe20,
             (SquareMatrix<double,_3> *)in_stack_fffffffffffffe18);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x25572a);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x255737);
  local_120 = SquareMatrix<double,_3>::trace(&local_78);
  local_128 = ((double)in_RDI[0x1f] * (double)in_RDI[0x22] * local_120) / 0.0008368;
  dVar4 = (double)in_RDI[0x27];
  RVar3 = Thermo::getVolume((Thermo *)in_stack_fffffffffffffe20);
  local_130 = ((dVar4 * RVar3) / 163882576.0) / 0.0004184;
  Snapshot::getHmat(in_stack_fffffffffffffe18);
  pdVar2 = RectMatrix<double,_3U,_3U>::operator()
                     (&local_178,*(uint *)((long)in_RDI + 0x334),*(uint *)((long)in_RDI + 0x334));
  dVar4 = *pdVar2;
  pdVar2 = RectMatrix<double,_3U,_3U>::operator()
                     (&local_178,*(uint *)(in_RDI + 0x67),*(uint *)(in_RDI + 0x67));
  dVar4 = (local_20 + local_28 + local_30 + local_128 + local_130) -
          ((double)in_RDI[0x65] * dVar4 * *pdVar2) / 0.0004184;
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2558cd);
  SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x2558da);
  return dVar4;
}

Assistant:

RealType NgammaT::calcConservedQuantity() {
    thermostat = snap->getThermostat();
    loadEta();

    // We need NkBT a lot, so just set it here: This is the RAW number
    // of integrableObjects, so no subtraction or addition of constraints or
    // orientational degrees of freedom:
    NkBT = info_->getNGlobalIntegrableObjects() * Constants::kB * targetTemp;

    // fkBT is used because the thermostat operates on more degrees of freedom
    // than the barostat (when there are particles with orientational degrees
    // of freedom).
    fkBT = info_->getNdf() * Constants::kB * targetTemp;

    RealType totalEnergy = thermo.getTotalEnergy();

    RealType thermostat_kinetic = fkBT * tt2 * thermostat.first *
                                  thermostat.first /
                                  (2.0 * Constants::energyConvert);

    RealType thermostat_potential =
        fkBT * thermostat.second / Constants::energyConvert;

    SquareMatrix<RealType, 3> tmp = eta.transpose() * eta;
    RealType trEta                = tmp.trace();

    RealType barostat_kinetic =
        NkBT * tb2 * trEta / (2.0 * Constants::energyConvert);

    RealType barostat_potential =
        (targetPressure * thermo.getVolume() / Constants::pressureConvert) /
        Constants::energyConvert;

    Mat3x3d hmat  = snap->getHmat();
    RealType area = hmat(axis1_, axis1_) * hmat(axis2_, axis2_);

    RealType conservedQuantity =
        totalEnergy + thermostat_kinetic + thermostat_potential +
        barostat_kinetic + barostat_potential -
        surfaceTension_ * area / Constants::energyConvert;

    return conservedQuantity;
  }